

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

Fl_Tree_Item * __thiscall Fl_Tree_Item::find_child_item(Fl_Tree_Item *this,char *name)

{
  int iVar1;
  Fl_Tree_Item *pFVar2;
  char *pcVar3;
  int local_24;
  int t;
  char *name_local;
  Fl_Tree_Item *this_local;
  
  if (name != (char *)0x0) {
    for (local_24 = 0; iVar1 = children(this), local_24 < iVar1; local_24 = local_24 + 1) {
      pFVar2 = child(this,local_24);
      pcVar3 = label(pFVar2);
      if (pcVar3 != (char *)0x0) {
        pFVar2 = child(this,local_24);
        pcVar3 = label(pFVar2);
        iVar1 = strcmp(pcVar3,name);
        if (iVar1 == 0) {
          pFVar2 = child(this,local_24);
          return pFVar2;
        }
      }
    }
  }
  return (Fl_Tree_Item *)0x0;
}

Assistant:

const Fl_Tree_Item* Fl_Tree_Item::find_child_item(const char *name) const {
  if ( name )
    for ( int t=0; t<children(); t++ )
      if ( child(t)->label() )
        if ( strcmp(child(t)->label(), name) == 0 )
          return(child(t));
  return(0);
}